

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O3

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,LiteralIntegerExpression *expression)

{
  string *psVar1;
  Token local_40;
  
  this->isExpression = true;
  LiteralExpression::get_token(&local_40,&expression->super_LiteralExpression);
  psVar1 = Token::getLexem_abi_cxx11_(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x20,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.lexem._M_dataplus._M_p != &local_40.lexem.field_2) {
    operator_delete(local_40.lexem._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CppPrinter::visit(LiteralIntegerExpression* expression) {
    isExpression = true;
    output << expression->get_token().getLexem();
}